

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall
Json::Value::CZString::CZString(CZString *this,char *cstr,DuplicationPolicy allocate)

{
  if (allocate == duplicate) {
    cstr = duplicateStringValue(cstr,0xffffffff);
  }
  this->cstr_ = cstr;
  this->index_ = allocate;
  return;
}

Assistant:

Value::CZString::CZString(const char* cstr, DuplicationPolicy allocate)
    : cstr_(allocate == duplicate ? duplicateStringValue(cstr) : cstr),
      index_(allocate) {}